

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_avx2.c
# Opt level: O0

void aom_quantize_b_avx2(tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,
                        int16_t *round_ptr,int16_t *quant_ptr,int16_t *quant_shift_ptr,
                        tran_low_t *qcoeff_ptr,tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,
                        uint16_t *eob_ptr,int16_t *scan,int16_t *iscan)

{
  undefined1 auVar1 [32];
  __m256i eob256;
  __m256i coeff_vals;
  __m256i coeff_vals_00;
  __m256i v_mask;
  __m256i coeff_vals_01;
  __m256i coeff_vals_02;
  __m256i v_mask_00;
  __m256i v_eobmax_00;
  __m256i v_eobmax_01;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  int16_t iVar4;
  long in_RSI;
  long in_RDI;
  __m256i *in_R9;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [32];
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  longlong lVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined1 auVar8 [64];
  undefined8 *in_stack_00000008;
  intptr_t count;
  __m256i v_nz_mask;
  __m256i v_eobmax;
  __m256i v_quant_shift;
  __m256i v_dequant;
  __m256i v_quant;
  __m256i v_round;
  __m256i v_zbin;
  __m256i v_dqcoeff_1;
  __m256i v_qcoeff_1;
  __m256i v_nz_mask_2;
  __m256i v_tmp32_1;
  __m256i v_tmp32_b_1;
  __m256i v_tmp32_a_1;
  __m256i v_tmp_rnd_1;
  __m256i v_zbin_mask_1;
  __m256i v_abs_coeff_1;
  __m256i v_coeff_1;
  __m256i v_dqcoeff;
  __m256i v_qcoeff;
  __m256i v_nz_mask_1;
  __m256i v_tmp32;
  __m256i v_tmp32_b;
  __m256i v_tmp32_a;
  __m256i v_tmp_rnd;
  __m256i v_zbin_mask;
  __m256i v_abs_coeff;
  __m256i v_coeff;
  uint in_stack_fffffffffffff144;
  int in_stack_fffffffffffff148;
  undefined1 (*dequant_ptr_00) [32];
  undefined1 (*coeff_ptr_00) [32];
  undefined1 (*pauVar15) [32];
  undefined1 (*shift_ptr) [32];
  long local_e88;
  __m256i *in_stack_fffffffffffff188;
  tran_low_t *in_stack_fffffffffffff190;
  tran_low_t *coeff_ptr_01;
  __m256i *in_stack_fffffffffffff198;
  undefined8 in_stack_fffffffffffff1c0;
  undefined8 in_stack_fffffffffffff1c8;
  longlong in_stack_fffffffffffff1d0;
  longlong lVar16;
  undefined8 uStack_e28;
  undefined1 local_e20 [16];
  int16_t *iscan_00;
  undefined8 uStack_e08;
  undefined1 local_e00 [32];
  undefined1 local_de0 [32];
  undefined1 local_dc0 [2] [32];
  long local_d70;
  long local_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined1 local_d40 [32];
  undefined1 local_d20 [32];
  undefined1 local_d00 [24];
  undefined8 uStack_ce8;
  undefined1 local_ce0 [32];
  undefined1 local_cc0 [32];
  undefined1 local_ca0 [32];
  undefined1 local_c80 [32];
  undefined1 local_c60 [32];
  undefined1 local_c40 [32];
  undefined1 local_c20 [32];
  undefined1 (*local_c00) [32];
  undefined1 (*local_bf8) [32];
  undefined1 (*local_bf0) [32];
  undefined1 (*local_be8) [32];
  undefined1 (*local_be0) [32];
  tran_low_t *local_bd8;
  undefined8 *local_bd0;
  long local_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  tran_low_t *ptStack_bb0;
  undefined8 uStack_ba8;
  undefined1 local_ba0 [32];
  undefined1 local_b80 [32];
  undefined1 local_b60 [32];
  undefined1 local_b40 [32];
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [24];
  undefined8 uStack_a88;
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined1 (*local_9a0) [32];
  undefined1 (*local_998) [32];
  undefined1 (*local_990) [32];
  undefined1 (*local_988) [32];
  undefined1 (*local_980) [32];
  tran_low_t *local_978;
  undefined8 *local_970;
  long local_968;
  undefined8 local_960;
  undefined8 uStack_958;
  tran_low_t *ptStack_950;
  undefined8 uStack_948;
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  ulong uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  ulong uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  long lStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  long lStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  tran_low_t *local_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 *local_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  tran_low_t *local_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 *local_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  tran_low_t *local_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 *local_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  tran_low_t *local_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 *local_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  long lStack_328;
  undefined1 local_320 [32];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  long lStack_2e8;
  undefined1 local_2e0 [32];
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  
  local_d60 = 0;
  uStack_d58 = 0;
  uStack_d50 = 0;
  uStack_d48 = 0;
  uVar5 = 0;
  uVar9 = 0;
  uVar6 = 0;
  uVar10 = 0;
  lVar12 = 0;
  uVar14 = 0;
  shift_ptr = (undefined1 (*) [32])&stack0xfffffffffffff1c0;
  dequant_ptr_00 = (undefined1 (*) [32])local_e20;
  pauVar15 = local_dc0;
  coeff_ptr_00 = &local_de0;
  uVar11 = 0;
  uVar13 = 0;
  local_d70 = in_RSI;
  local_d68 = in_RDI;
  load_b_values_avx2((int16_t *)0x0,(__m256i *)0x0,(int16_t *)0x0,in_stack_fffffffffffff198,
                     (int16_t *)in_stack_fffffffffffff190,in_stack_fffffffffffff188,
                     (int16_t *)dequant_ptr_00,in_R9,(int16_t *)shift_ptr,
                     (__m256i *)((ulong)in_stack_fffffffffffff144 << 0x20),in_stack_fffffffffffff148
                    );
  local_968 = local_d68;
  local_970 = in_stack_00000008;
  local_978 = qcoeff_ptr;
  local_9a0 = shift_ptr;
  local_998 = pauVar15;
  local_990 = coeff_ptr_00;
  local_988 = dequant_ptr_00;
  local_980 = &local_e00;
  load_coefficients_avx2((tran_low_t *)coeff_ptr_00);
  auVar7._8_8_ = uVar9;
  auVar7._0_8_ = uVar5;
  auVar7._16_8_ = uVar11;
  auVar7._24_8_ = uVar13;
  local_9e0 = vpabsw_avx2(auVar7);
  local_640 = *(undefined8 *)*local_998;
  uStack_638 = *(undefined8 *)(*local_998 + 8);
  uStack_630 = *(undefined8 *)(*local_998 + 0x10);
  uStack_628 = *(undefined8 *)(*local_998 + 0x18);
  local_620 = local_9e0._0_8_;
  uStack_618 = local_9e0._8_8_;
  uStack_610 = local_9e0._16_8_;
  uStack_608 = local_9e0._24_8_;
  local_a00 = vpcmpgtw_avx2(local_9e0,*local_998);
  local_580 = local_a00._0_8_;
  uStack_578 = local_a00._8_8_;
  uStack_570 = local_a00._16_8_;
  lStack_568 = local_a00._24_8_;
  local_9c0 = uVar5;
  uStack_9b8 = uVar9;
  uStack_9b0 = uVar11;
  uStack_9a8 = uVar13;
  local_6c0 = uVar5;
  uStack_6b8 = uVar9;
  uStack_6b0 = uVar11;
  uStack_6a8 = uVar13;
  if ((((((((((((((((((((((((((((((((local_a00 >> 7 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0 &&
                                   (local_a00 >> 0xf & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (local_a00 >> 0x17 & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                                 (local_a00 >> 0x1f & (undefined1  [32])0x1) ==
                                 (undefined1  [32])0x0) &&
                                (local_a00 >> 0x27 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                ) && (local_a00 >> 0x2f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                              (local_a00 >> 0x37 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && (local_a00 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                             ) && (local_a00 >> 0x47 & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                           (local_a00 >> 0x4f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_a00 >> 0x57 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (local_a00 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_a00 >> 0x67 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (local_a00 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_a00 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_a00 >> 0x7f,0) == '\0') &&
                    (local_a00 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (local_a00 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (local_a00 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (local_a00 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_a00 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               (local_a00 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (local_a00 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(local_a00 >> 0xbf,0) == '\0') &&
            (local_a00 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           (local_a00 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (local_a00 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         (local_a00 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
        (local_a00 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
       (local_a00 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
      (local_a00 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
      -1 < (long)local_a00._24_8_) {
    local_8c0 = ZEXT832(0) << 0x20;
    local_8a0._8_8_ = SUB328(ZEXT832(0),4);
    local_448 = local_970;
    local_480 = 0;
    uStack_478 = local_8a0._8_8_;
    uStack_470 = 0;
    uStack_468 = 0;
    *local_970 = 0;
    local_970[1] = local_8a0._8_8_;
    local_970[2] = 0;
    local_970[3] = 0;
    local_488 = local_978;
    local_4c0 = 0;
    uStack_4b8 = local_8a0._8_8_;
    uStack_4b0 = 0;
    uStack_4a8 = 0;
    local_978[0] = 0;
    local_978[1] = 0;
    *(undefined8 *)(local_978 + 2) = local_8a0._8_8_;
    local_978[4] = 0;
    local_978[5] = 0;
    local_978[6] = 0;
    local_978[7] = 0;
    local_4c8 = local_970 + 4;
    local_920 = ZEXT832(0) << 0x20;
    local_8e0._8_8_ = SUB328(ZEXT832(0),4);
    local_500 = 0;
    uStack_4f8 = local_8e0._8_8_;
    uStack_4f0 = 0;
    uStack_4e8 = 0;
    *local_4c8 = 0;
    local_970[5] = local_8e0._8_8_;
    local_970[6] = 0;
    local_970[7] = 0;
    local_508 = local_978 + 8;
    local_540 = 0;
    uStack_538 = local_8e0._8_8_;
    uStack_530 = 0;
    uStack_528 = 0;
    local_508[0] = 0;
    local_508[1] = 0;
    *(undefined8 *)(local_978 + 10) = local_8e0._8_8_;
    local_978[0xc] = 0;
    local_978[0xd] = 0;
    local_978[0xe] = 0;
    local_978[0xf] = 0;
    local_960 = 0;
    uStack_958 = local_8e0._8_8_;
    ptStack_950 = (tran_low_t *)0x0;
    uStack_948 = 0;
    local_900 = local_920;
    local_8e0 = local_920;
    local_8a0 = local_8c0;
  }
  else {
    local_2c0 = *(undefined8 *)*local_990;
    uStack_2b8 = *(undefined8 *)(*local_990 + 8);
    uStack_2b0 = *(undefined8 *)(*local_990 + 0x10);
    uStack_2a8 = *(undefined8 *)(*local_990 + 0x18);
    local_2a0 = local_9e0._0_8_;
    uStack_298 = local_9e0._8_8_;
    uStack_290 = local_9e0._16_8_;
    uStack_288 = local_9e0._24_8_;
    local_320 = vpaddsw_avx2(local_9e0,*local_990);
    local_340 = local_a00._0_8_;
    uStack_338 = local_a00._8_8_;
    uStack_330 = local_a00._16_8_;
    lStack_328 = local_a00._24_8_;
    local_a20 = vpand_avx2(local_320,local_a00);
    local_200 = *(undefined8 *)*local_980;
    uStack_1f8 = *(undefined8 *)(*local_980 + 8);
    uStack_1f0 = *(undefined8 *)(*local_980 + 0x10);
    uStack_1e8 = *(undefined8 *)(*local_980 + 0x18);
    local_1e0 = local_a20._0_8_;
    uStack_1d8 = local_a20._8_8_;
    uStack_1d0 = local_a20._16_8_;
    uStack_1c8 = local_a20._24_8_;
    local_a40 = vpmulhw_avx2(local_a20,*local_980);
    local_720 = local_a40._0_8_;
    uStack_718 = local_a40._8_8_;
    uStack_710 = local_a40._16_8_;
    uStack_708 = local_a40._24_8_;
    local_740 = local_a20._0_8_;
    uStack_738 = local_a20._8_8_;
    uStack_730 = local_a20._16_8_;
    uStack_728 = local_a20._24_8_;
    local_a60 = vpaddw_avx2(local_a40,local_a20);
    local_240 = *(undefined8 *)*local_9a0;
    uStack_238 = *(undefined8 *)((long)*local_9a0 + 8);
    uStack_230 = *(undefined8 *)((long)*local_9a0 + 0x10);
    uStack_228 = *(undefined8 *)((long)*local_9a0 + 0x18);
    local_220 = local_a60._0_8_;
    uStack_218 = local_a60._8_8_;
    uStack_210 = local_a60._16_8_;
    uStack_208 = local_a60._24_8_;
    local_a80 = vpmulhw_avx2(local_a60,*local_9a0);
    local_940._8_8_ = SUB328(ZEXT832(0),4);
    local_660 = local_a80._0_8_;
    uStack_658 = local_a80._8_8_;
    uStack_650 = local_a80._16_8_;
    uStack_648 = local_a80._24_8_;
    local_680 = 0;
    uStack_678 = local_940._8_8_;
    uStack_670 = 0;
    uStack_668 = 0;
    _local_aa0 = vpcmpgtw_avx2(local_a80,ZEXT832((ulong)local_940._8_8_) << 0x40);
    local_120 = local_a80._0_8_;
    uStack_118 = local_a80._8_8_;
    uStack_110 = local_a80._16_8_;
    uStack_108 = local_a80._24_8_;
    auVar1._8_8_ = uVar9;
    auVar1._0_8_ = uVar5;
    auVar1._16_8_ = uVar11;
    auVar1._24_8_ = uVar13;
    local_ac0 = vpsignw_avx2(local_a80,auVar1);
    local_c0 = *(undefined8 *)*local_988;
    uStack_b8 = *(undefined8 *)((long)*local_988 + 8);
    uStack_b0 = *(undefined8 *)((long)*local_988 + 0x10);
    uStack_a8 = *(undefined8 *)((long)*local_988 + 0x18);
    local_a0 = local_ac0._0_8_;
    uStack_98 = local_ac0._8_8_;
    uStack_90 = local_ac0._16_8_;
    uStack_88 = local_ac0._24_8_;
    local_ae0 = vpmullw_avx2(local_ac0,*local_988);
    coeff_vals[1] = uVar6;
    coeff_vals[0] = (longlong)in_stack_fffffffffffff198;
    coeff_vals[2] = uVar10;
    coeff_vals[3] = lVar12;
    local_940 = ZEXT832(0) << 0x20;
    local_140 = uVar5;
    uStack_138 = uVar9;
    uStack_130 = uVar11;
    uStack_128 = uVar13;
    store_coefficients_avx2(coeff_vals,in_stack_fffffffffffff190);
    coeff_vals_00[1] = uVar6;
    coeff_vals_00[0] = (longlong)in_stack_fffffffffffff198;
    coeff_vals_00[2] = uVar10;
    coeff_vals_00[3] = lVar12;
    store_coefficients_avx2(coeff_vals_00,in_stack_fffffffffffff190);
    local_960 = local_aa0._0_8_;
    uStack_958 = local_aa0._8_8_;
    ptStack_950 = (tran_low_t *)local_aa0._16_8_;
    uStack_948 = uStack_a88;
  }
  v_eobmax_00[1] = in_stack_fffffffffffff1c0;
  v_eobmax_00[0] = uVar14;
  v_eobmax_00[2] = in_stack_fffffffffffff1c8;
  v_eobmax_00[3] = in_stack_fffffffffffff1d0;
  v_mask[1] = uVar6;
  v_mask[0] = uStack_948;
  v_mask[2] = uVar10;
  v_mask[3] = lVar12;
  coeff_ptr_01 = ptStack_950;
  uVar5 = uStack_948;
  get_max_lane_eob(iscan_00,v_eobmax_00,v_mask);
  local_760 = local_de0._0_8_;
  uStack_758 = local_de0._8_8_;
  uStack_750 = local_de0._16_8_;
  uStack_748 = local_de0._24_8_;
  local_780 = local_de0._0_8_;
  uStack_778 = local_de0._8_8_;
  uStack_770 = local_de0._16_8_;
  uStack_768 = local_de0._24_8_;
  local_de0 = vpunpckhqdq_avx2(local_de0,local_de0);
  local_7a0 = local_e00._0_8_;
  uStack_798 = local_e00._8_8_;
  uStack_790 = local_e00._16_8_;
  uStack_788 = local_e00._24_8_;
  local_7c0 = local_e00._0_8_;
  uStack_7b8 = local_e00._8_8_;
  uStack_7b0 = local_e00._16_8_;
  uStack_7a8 = local_e00._24_8_;
  local_e00 = vpunpckhqdq_avx2(local_e00,local_e00);
  local_7e0 = local_e20._0_8_;
  uStack_7d8 = local_e20._8_8_;
  uStack_7c8 = uStack_e08;
  local_800 = local_e20._0_8_;
  uStack_7f8 = local_e20._8_8_;
  uStack_7e8 = uStack_e08;
  auVar7 = vpunpckhqdq_avx2(_local_e20,_local_e20);
  auVar3._8_8_ = in_stack_fffffffffffff1c8;
  auVar3._0_8_ = in_stack_fffffffffffff1c0;
  auVar3._16_8_ = in_stack_fffffffffffff1d0;
  auVar3._24_8_ = uStack_e28;
  auVar2._8_8_ = in_stack_fffffffffffff1c8;
  auVar2._0_8_ = in_stack_fffffffffffff1c0;
  auVar2._16_8_ = in_stack_fffffffffffff1d0;
  auVar2._24_8_ = uStack_e28;
  auVar1 = vpunpckhqdq_avx2(auVar3,auVar2);
  uVar9 = auVar1._0_8_;
  uVar11 = auVar1._8_8_;
  lVar16 = auVar1._16_8_;
  local_860 = local_dc0[0]._0_8_;
  uStack_858 = local_dc0[0]._8_8_;
  uStack_850 = local_dc0[0]._16_8_;
  uStack_848 = local_dc0[0]._24_8_;
  local_880 = local_dc0[0]._0_8_;
  uStack_878 = local_dc0[0]._8_8_;
  uStack_870 = local_dc0[0]._16_8_;
  uStack_868 = local_dc0[0]._24_8_;
  local_dc0[0] = vpunpckhqdq_avx2(local_dc0[0],local_dc0[0]);
  auVar8 = ZEXT3264(local_dc0[0]);
  uStack_7f0 = iscan_00;
  uStack_7d0 = iscan_00;
  while (_local_e20 = auVar7, local_e88 = local_d70 + -0x10, auVar7 = auVar8._0_32_, 0 < local_e88)
  {
    local_d68 = local_d68 + 0x40;
    in_stack_00000008 = in_stack_00000008 + 8;
    qcoeff_ptr = qcoeff_ptr + 0x10;
    local_be0 = &local_e00;
    local_be8 = (undefined1 (*) [32])local_e20;
    local_bf0 = &local_de0;
    local_bf8 = local_dc0;
    local_c00 = (undefined1 (*) [32])&stack0xfffffffffffff1c0;
    local_bd8 = qcoeff_ptr;
    local_bd0 = in_stack_00000008;
    local_bc8 = local_d68;
    load_coefficients_avx2((tran_low_t *)coeff_ptr_00);
    local_c20._0_8_ = auVar7._0_8_;
    local_c20._8_8_ = auVar7._8_8_;
    local_c20._16_8_ = auVar7._16_8_;
    local_c20._24_8_ = auVar7._24_8_;
    local_6a0 = local_c20._0_8_;
    uStack_698 = local_c20._8_8_;
    uStack_690 = local_c20._16_8_;
    uStack_688 = local_c20._24_8_;
    local_c40 = vpabsw_avx2(auVar7);
    local_5c0 = *(undefined8 *)*local_bf8;
    uStack_5b8 = *(undefined8 *)(*local_bf8 + 8);
    uStack_5b0 = *(undefined8 *)(*local_bf8 + 0x10);
    uStack_5a8 = *(undefined8 *)(*local_bf8 + 0x18);
    local_5a0 = local_c40._0_8_;
    uStack_598 = local_c40._8_8_;
    uStack_590 = local_c40._16_8_;
    uStack_588 = local_c40._24_8_;
    local_c60 = vpcmpgtw_avx2(local_c40,*local_bf8);
    local_560 = local_c60._0_8_;
    uStack_558 = local_c60._8_8_;
    uStack_550 = local_c60._16_8_;
    lStack_548 = local_c60._24_8_;
    local_c20 = auVar7;
    if ((((((((((((((((((((((((((((((((local_c60 >> 7 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0 &&
                                     (local_c60 >> 0xf & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (local_c60 >> 0x17 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (local_c60 >> 0x1f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (local_c60 >> 0x27 & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                                 (local_c60 >> 0x2f & (undefined1  [32])0x1) ==
                                 (undefined1  [32])0x0) &&
                                (local_c60 >> 0x37 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                ) && (local_c60 >> 0x3f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                              (local_c60 >> 0x47 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && (local_c60 >> 0x4f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                             ) && (local_c60 >> 0x57 & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                           (local_c60 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_c60 >> 0x67 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (local_c60 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_c60 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_c60 >> 0x7f,0) == '\0') &&
                      (local_c60 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (local_c60 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_c60 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (local_c60 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (local_c60 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (local_c60 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_c60 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_c60 >> 0xbf,0) == '\0') &&
              (local_c60 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             (local_c60 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (local_c60 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           (local_c60 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (local_c60 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         (local_c60 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
        (local_c60 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
        -1 < (long)local_c60._24_8_) {
      local_b20 = ZEXT832(0) << 0x20;
      local_b00._8_8_ = SUB328(ZEXT832(0),4);
      local_348 = local_bd0;
      local_380 = 0;
      uStack_378 = local_b00._8_8_;
      uStack_370 = 0;
      uStack_368 = 0;
      *local_bd0 = 0;
      local_bd0[1] = local_b00._8_8_;
      local_bd0[2] = 0;
      local_bd0[3] = 0;
      local_388 = local_bd8;
      local_3c0 = 0;
      uStack_3b8 = local_b00._8_8_;
      uStack_3b0 = 0;
      uStack_3a8 = 0;
      local_bd8[0] = 0;
      local_bd8[1] = 0;
      *(undefined8 *)(local_bd8 + 2) = local_b00._8_8_;
      local_bd8[4] = 0;
      local_bd8[5] = 0;
      local_bd8[6] = 0;
      local_bd8[7] = 0;
      local_3c8 = local_bd0 + 4;
      local_b80 = ZEXT832(0) << 0x20;
      local_b40._8_8_ = SUB328(ZEXT832(0),4);
      local_400 = 0;
      uStack_3f8 = local_b40._8_8_;
      uStack_3f0 = 0;
      uStack_3e8 = 0;
      *local_3c8 = 0;
      local_bd0[5] = local_b40._8_8_;
      local_bd0[6] = 0;
      local_bd0[7] = 0;
      local_408 = local_bd8 + 8;
      local_440 = 0;
      uStack_438 = local_b40._8_8_;
      uStack_430 = 0;
      uStack_428 = 0;
      local_408[0] = 0;
      local_408[1] = 0;
      *(undefined8 *)(local_bd8 + 10) = local_b40._8_8_;
      local_bd8[0xc] = 0;
      local_bd8[0xd] = 0;
      local_bd8[0xe] = 0;
      local_bd8[0xf] = 0;
      local_bc0 = 0;
      uStack_bb8 = local_b40._8_8_;
      ptStack_bb0 = (tran_low_t *)0x0;
      uStack_ba8 = 0;
      local_b60 = local_b80;
      local_b40 = local_b80;
      local_b00 = local_b20;
    }
    else {
      local_280 = *(undefined8 *)*local_bf0;
      uStack_278 = *(undefined8 *)(*local_bf0 + 8);
      uStack_270 = *(undefined8 *)(*local_bf0 + 0x10);
      uStack_268 = *(undefined8 *)(*local_bf0 + 0x18);
      local_260 = local_c40._0_8_;
      uStack_258 = local_c40._8_8_;
      uStack_250 = local_c40._16_8_;
      uStack_248 = local_c40._24_8_;
      local_2e0 = vpaddsw_avx2(local_c40,*local_bf0);
      local_300 = local_c60._0_8_;
      uStack_2f8 = local_c60._8_8_;
      uStack_2f0 = local_c60._16_8_;
      lStack_2e8 = local_c60._24_8_;
      local_c80 = vpand_avx2(local_2e0,local_c60);
      local_180 = *(undefined8 *)*local_be0;
      uStack_178 = *(undefined8 *)(*local_be0 + 8);
      uStack_170 = *(undefined8 *)(*local_be0 + 0x10);
      uStack_168 = *(undefined8 *)(*local_be0 + 0x18);
      local_160 = local_c80._0_8_;
      uStack_158 = local_c80._8_8_;
      uStack_150 = local_c80._16_8_;
      uStack_148 = local_c80._24_8_;
      local_ca0 = vpmulhw_avx2(local_c80,*local_be0);
      local_6e0 = local_ca0._0_8_;
      uStack_6d8 = local_ca0._8_8_;
      uStack_6d0 = local_ca0._16_8_;
      uStack_6c8 = local_ca0._24_8_;
      local_700 = local_c80._0_8_;
      uStack_6f8 = local_c80._8_8_;
      uStack_6f0 = local_c80._16_8_;
      uStack_6e8 = local_c80._24_8_;
      local_cc0 = vpaddw_avx2(local_ca0,local_c80);
      local_1c0 = *(undefined8 *)*local_c00;
      uStack_1b8 = *(undefined8 *)(*local_c00 + 8);
      uStack_1b0 = *(undefined8 *)(*local_c00 + 0x10);
      uStack_1a8 = *(undefined8 *)(*local_c00 + 0x18);
      local_1a0 = local_cc0._0_8_;
      uStack_198 = local_cc0._8_8_;
      uStack_190 = local_cc0._16_8_;
      uStack_188 = local_cc0._24_8_;
      local_ce0 = vpmulhw_avx2(local_cc0,*local_c00);
      local_ba0._8_8_ = SUB328(ZEXT832(0),4);
      local_5e0 = local_ce0._0_8_;
      uStack_5d8 = local_ce0._8_8_;
      uStack_5d0 = local_ce0._16_8_;
      uStack_5c8 = local_ce0._24_8_;
      local_600 = 0;
      uStack_5f8 = local_ba0._8_8_;
      uStack_5f0 = 0;
      uStack_5e8 = 0;
      _local_d00 = vpcmpgtw_avx2(local_ce0,ZEXT832((ulong)local_ba0._8_8_) << 0x40);
      local_e0 = local_ce0._0_8_;
      uStack_d8 = local_ce0._8_8_;
      uStack_d0 = local_ce0._16_8_;
      uStack_c8 = local_ce0._24_8_;
      local_100 = local_c20._0_8_;
      uStack_f8 = local_c20._8_8_;
      uStack_f0 = local_c20._16_8_;
      uStack_e8 = local_c20._24_8_;
      local_d20 = vpsignw_avx2(local_ce0,auVar7);
      local_80 = *(undefined8 *)*local_be8;
      uStack_78 = *(undefined8 *)(*local_be8 + 8);
      uStack_70 = *(undefined8 *)(*local_be8 + 0x10);
      uStack_68 = *(undefined8 *)(*local_be8 + 0x18);
      local_60 = local_d20._0_8_;
      uStack_58 = local_d20._8_8_;
      uStack_50 = local_d20._16_8_;
      uStack_48 = local_d20._24_8_;
      local_d40 = vpmullw_avx2(local_d20,*local_be8);
      coeff_vals_01[1] = uVar6;
      coeff_vals_01[0] = uVar5;
      coeff_vals_01[2] = uVar10;
      coeff_vals_01[3] = lVar12;
      local_ba0 = ZEXT832(0) << 0x20;
      store_coefficients_avx2(coeff_vals_01,coeff_ptr_01);
      coeff_vals_02[1] = uVar6;
      coeff_vals_02[0] = uVar5;
      coeff_vals_02[2] = uVar10;
      coeff_vals_02[3] = lVar12;
      store_coefficients_avx2(coeff_vals_02,coeff_ptr_01);
      local_bc0 = local_d00._0_8_;
      uStack_bb8 = local_d00._8_8_;
      ptStack_bb0 = (tran_low_t *)local_d00._16_8_;
      uStack_ba8 = uStack_ce8;
    }
    auVar8 = ZEXT3264(CONCAT824(uVar14,CONCAT816(lVar12,CONCAT88(uVar10,uVar6))));
    v_eobmax_01[1] = uVar9;
    v_eobmax_01[0] = uVar14;
    v_eobmax_01[2] = uVar11;
    v_eobmax_01[3] = lVar16;
    v_mask_00[1] = uVar6;
    v_mask_00[0] = uStack_ba8;
    v_mask_00[2] = uVar10;
    v_mask_00[3] = lVar12;
    coeff_ptr_01 = ptStack_bb0;
    uVar5 = uStack_ba8;
    get_max_lane_eob(iscan_00,v_eobmax_01,v_mask_00);
    uVar6 = auVar8._0_8_;
    uVar10 = auVar8._8_8_;
    lVar12 = auVar8._16_8_;
    uVar14 = auVar8._24_8_;
    auVar7 = _local_e20;
    local_d70 = local_e88;
  }
  eob256[1] = (longlong)coeff_ptr_00;
  eob256[0] = (longlong)dequant_ptr_00;
  eob256[2] = (longlong)pauVar15;
  eob256[3] = (longlong)shift_ptr;
  iVar4 = accumulate_eob256(eob256);
  *dequant_ptr = iVar4;
  return;
}

Assistant:

void aom_quantize_b_avx2(const tran_low_t *coeff_ptr, intptr_t n_coeffs,
                         const int16_t *zbin_ptr, const int16_t *round_ptr,
                         const int16_t *quant_ptr,
                         const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
                         tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr,
                         uint16_t *eob_ptr, const int16_t *scan,
                         const int16_t *iscan) {
  (void)scan;
  __m256i v_zbin, v_round, v_quant, v_dequant, v_quant_shift;
  __m256i v_eobmax = _mm256_setzero_si256();

  load_b_values_avx2(zbin_ptr, &v_zbin, round_ptr, &v_round, quant_ptr,
                     &v_quant, dequant_ptr, &v_dequant, quant_shift_ptr,
                     &v_quant_shift, 0);

  // Do DC and first 15 AC.
  __m256i v_nz_mask =
      quantize_b_logscale0_16(coeff_ptr, qcoeff_ptr, dqcoeff_ptr, &v_quant,
                              &v_dequant, &v_round, &v_zbin, &v_quant_shift);

  v_eobmax = get_max_lane_eob(iscan, v_eobmax, v_nz_mask);

  v_round = _mm256_unpackhi_epi64(v_round, v_round);
  v_quant = _mm256_unpackhi_epi64(v_quant, v_quant);
  v_dequant = _mm256_unpackhi_epi64(v_dequant, v_dequant);
  v_quant_shift = _mm256_unpackhi_epi64(v_quant_shift, v_quant_shift);
  v_zbin = _mm256_unpackhi_epi64(v_zbin, v_zbin);

  for (intptr_t count = n_coeffs - 16; count > 0; count -= 16) {
    coeff_ptr += 16;
    qcoeff_ptr += 16;
    dqcoeff_ptr += 16;
    iscan += 16;
    v_nz_mask =
        quantize_b_logscale0_16(coeff_ptr, qcoeff_ptr, dqcoeff_ptr, &v_quant,
                                &v_dequant, &v_round, &v_zbin, &v_quant_shift);

    v_eobmax = get_max_lane_eob(iscan, v_eobmax, v_nz_mask);
  }

  *eob_ptr = accumulate_eob256(v_eobmax);
}